

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O3

void __thiscall
ProgramStreamDemuxer::ProgramStreamDemuxer
          (ProgramStreamDemuxer *this,BufferedReaderManager *readManager)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *streamName;
  int iVar2;
  AbstractReader *pAVar3;
  
  p_Var1 = &(this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_AbstractDemuxer).m_fileBlockSize = 0x200000;
  (this->super_AbstractDemuxer).m_timeOffset = 0;
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer =
       (_func_int **)&PTR__ProgramStreamDemuxer_0023f150;
  memset(this->m_tmpBuffer,0,0x3fa);
  this->m_readManager = readManager;
  this->m_dataProcessed = 0;
  streamName = &(this->m_streamName).field_2;
  (this->m_streamName)._M_dataplus._M_p = (pointer)streamName;
  (this->m_streamName)._M_string_length = 0;
  (this->m_streamName).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  memset(this->m_psm_es_type,0,0x100);
  memset(this->m_lpcmWaveHeader,0,0x210);
  pAVar3 = BufferedReaderManager::getReader(readManager,streamName->_M_local_buf);
  this->m_bufferedReader = pAVar3;
  iVar2 = (*pAVar3->_vptr_AbstractReader[6])(pAVar3,0x3fa);
  this->m_readerID = iVar2;
  this->m_lastReadRez = 0;
  this->m_lastPesLen = 0;
  this->m_lastPID = 0;
  this->m_tmpBufferLen = 0;
  *(undefined4 *)&this->m_firstVideoPTS = 0xffffffff;
  *(undefined4 *)((long)&this->m_firstVideoPTS + 4) = 0xffffffff;
  *(undefined4 *)&this->m_firstPTS = 0xffffffff;
  *(undefined4 *)((long)&this->m_firstPTS + 4) = 0xffffffff;
  return;
}

Assistant:

ProgramStreamDemuxer::ProgramStreamDemuxer(const BufferedReaderManager& readManager)
    : m_tmpBuffer{}, m_readManager(readManager), m_dataProcessed(0)
{
    memset(m_psm_es_type, 0, sizeof(m_psm_es_type));
    memset(m_lpcpHeaderAdded, 0, sizeof(m_lpcpHeaderAdded));
    m_bufferedReader = m_readManager.getReader(m_streamName.c_str());
    m_readerID = m_bufferedReader->createReader(MAX_PES_HEADER_SIZE);
    m_lastReadRez = 0;
    m_lastPesLen = 0;
    m_lastPID = 0;
    m_tmpBufferLen = 0;
    m_firstPTS = -1;
    m_firstVideoPTS = -1;
}